

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void> *
pybind11::detail::load_type<std::__cxx11::string,void>
          (type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
           *conv,handle *handle)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  handle __lhs;
  undefined8 *in_RSI;
  type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  *in_RDI;
  handle in_stack_ffffffffffffff48;
  handle in_stack_ffffffffffffff80;
  bool in_stack_ffffffffffffffdf;
  string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  *in_stack_ffffffffffffffe0;
  
  bVar1 = string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
          ::load(in_stack_ffffffffffffffe0,(PyObject *)*in_RSI,in_stack_ffffffffffffffdf);
  if (!bVar1) {
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __cxa_allocate_exception(0x10);
    __lhs = pybind11::type::handle_of(in_stack_ffffffffffffff48);
    str::str((str *)__lhs.m_ptr,in_stack_ffffffffffffff80);
    object::cast<std::__cxx11::string>((object *)in_stack_ffffffffffffff48.m_ptr);
    std::operator+((char *)__lhs.m_ptr,__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs.m_ptr,
                   (char *)__rhs);
    cast_error::runtime_error((cast_error *)__rhs,(string *)in_stack_ffffffffffffff48.m_ptr);
    __cxa_throw(__rhs,&cast_error::typeinfo,cast_error::~cast_error);
  }
  return in_RDI;
}

Assistant:

type_caster<T, SFINAE> &load_type(type_caster<T, SFINAE> &conv, const handle &handle) {
    static_assert(!detail::is_pyobject<T>::value,
                  "Internal error: type_caster should only be used for C++ types");
    if (!conv.load(handle, true)) {
#if !defined(PYBIND11_DETAILED_ERROR_MESSAGES)
        throw cast_error(
            "Unable to cast Python instance of type "
            + str(type::handle_of(handle)).cast<std::string>()
            + " to C++ type '?' (#define "
              "PYBIND11_DETAILED_ERROR_MESSAGES or compile in debug mode for details)");
#else
        throw cast_error("Unable to cast Python instance of type "
                         + str(type::handle_of(handle)).cast<std::string>() + " to C++ type '"
                         + type_id<T>() + "'");
#endif
    }
    return conv;
}